

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::ComputeTransformDetails(transform_info *Td,v3i *Dims3,int NPasses,u64 TformOrder)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  u64 uVar9;
  v3i R3;
  v3i D3;
  v3i S3;
  ulong local_160;
  uint local_158;
  ulong local_150;
  uint local_148;
  ulong local_144;
  uint local_13c;
  undefined1 local_138 [272];
  
  local_148 = (Dims3->field_0).field_0.Z;
  local_150 = *(ulong *)&Dims3->field_0;
  local_158 = (Dims3->field_0).field_0.Z;
  local_160 = *(ulong *)&Dims3->field_0;
  local_144 = 0x100000001;
  local_13c = 1;
  uVar5 = (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
          ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
          (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  iVar2 = 0;
  uVar4 = 0x40000200001;
  lVar3 = 0;
  do {
    lVar3 = (long)(int)lVar3;
    lVar6 = lVar3 * 6 + 0x48;
    uVar9 = TformOrder;
    while( true ) {
      if (NPasses <= iVar2) {
        Td->TformOrder = uVar9;
        Td->StackSize = (int)lVar3;
        GetCdf53NormsFast<16>();
        memcpy(Td,local_138,0x110);
        Td->NPasses = NPasses;
        return;
      }
      uVar7 = (uint)uVar9;
      uVar1 = uVar7 & 3;
      uVar9 = uVar9 >> 2;
      if (uVar1 == 3) break;
      if (0x1f < (int)lVar3) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                     );
      }
      *(undefined8 *)((long)(Td->BasisNorms).ScalNorms.Arr + lVar6 * 4 + -0x10) = 0;
      *(ulong *)((long)(Td->BasisNorms).ScalNorms.Arr + lVar6 * 4 + -8) = uVar5;
      *(ulong *)((long)(Td->BasisNorms).ScalNorms.Arr + lVar6 * 4) = uVar4;
      (Td->StackAxes).Arr[lVar3] = uVar1;
      uVar8 = (ulong)((uVar7 & 3) << 2);
      uVar1 = *(uint *)((long)&local_150 + uVar8) | 1;
      *(uint *)((long)&local_160 + uVar8) = uVar1;
      uVar5 = (ulong)(local_158 & 0x1fffff) << 0x2a |
              (local_160 >> 0x20 & 0x1fffff) << 0x15 | local_160 & 0x1fffff;
      *(int *)((long)&local_144 + uVar8) = *(int *)((long)&local_144 + uVar8) << 1;
      *(int *)((long)&local_150 + uVar8) = (int)(uVar1 + 1) >> 1;
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + 6;
    }
    if (uVar9 != 3) {
      TformOrder = uVar9;
    }
    uVar4 = (ulong)(local_13c & 0x1fffff) << 0x2a |
            (local_144 >> 0x20 & 0x1fffff) << 0x15 | local_144 & 0x1fffff;
    local_158 = local_148;
    uVar5 = (ulong)(local_148 & 0x1fffff) << 0x2a |
            (local_150 >> 0x20 & 0x1fffff) << 0x15 | local_150 & 0x1fffff;
    local_160 = local_150;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void
ComputeTransformDetails(transform_info* Td, const v3i& Dims3, int NPasses, u64 TformOrder)
{
  int Pass = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  int StackSize = 0;
  while (Pass < NPasses)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Pass;
    }
    else
    {
      Td->StackGrids[StackSize] = G;
      Td->StackAxes[StackSize++] = D;
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }
  Td->TformOrder = TformOrder;
  Td->StackSize = StackSize;
  Td->BasisNorms = GetCdf53NormsFast<16>();
  Td->NPasses = NPasses;
}